

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_avappendf(cargo_astr_t *str,char *format,__va_list_tag *ap)

{
  char *pcVar1;
  undefined1 auStack_48 [8];
  va_list apc;
  int ret;
  __va_list_tag *ap_local;
  char *format_local;
  cargo_astr_t *str_local;
  
  apc[0].reg_save_area._4_4_ = 0;
  if (str == (cargo_astr_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x153,"int cargo_avappendf(cargo_astr_t *, const char *, struct __va_list_tag *)"
                 );
  }
  if (str->s != (char **)0x0) {
    if (*str->s == (char *)0x0) {
      if (str->l == 0) {
        str->l = 0x100;
      }
      str->offset = 0;
      pcVar1 = (char *)_cargo_calloc(1,str->l);
      *str->s = pcVar1;
      if (pcVar1 == (char *)0x0) {
        return -1;
      }
    }
    while( true ) {
      apc[0].overflow_arg_area = ap->reg_save_area;
      auStack_48._0_4_ = ap->gp_offset;
      auStack_48._4_4_ = ap->fp_offset;
      apc[0]._0_8_ = ap->overflow_arg_area;
      str->diff = str->l - str->offset;
      apc[0].reg_save_area._4_4_ =
           cargo_vsnprintf(*str->s + str->offset,str->diff,format,(__va_list_tag *)auStack_48);
      if (apc[0].reg_save_area._4_4_ < 0) {
        return -1;
      }
      if ((ulong)(long)apc[0].reg_save_area._4_4_ < str->diff) break;
      if (str->l == 0) {
        str->l = 0x100;
      }
      str->l = str->l << 1;
      pcVar1 = (char *)_cargo_realloc(*str->s,str->l);
      *str->s = pcVar1;
      if (pcVar1 == (char *)0x0) {
        return -1;
      }
    }
    str->offset = (long)apc[0].reg_save_area._4_4_ + str->offset;
    return apc[0].reg_save_area._4_4_;
  }
  __assert_fail("str->s",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x154,"int cargo_avappendf(cargo_astr_t *, const char *, struct __va_list_tag *)");
}

Assistant:

int cargo_avappendf(cargo_astr_t *str, const char *format, va_list ap)
{
    int ret = 0;
    va_list apc;
    assert(str);
    assert(str->s);

    if (!(*str->s))
    {
        if (str->l == 0)
        {
            str->l = CARGO_ASTR_DEFAULT_SIZE;
        }

        str->offset = 0;

        if (!(*str->s = _cargo_calloc(1, str->l)))
        {
            CARGODBG(1, "Out of memory!\n");
            return -1;
        }
    }

    while (1)
    {
        // We must copy the va_list otherwise it will be
        // out of sync on a realloc.
        va_copy(apc, ap);

        str->diff = (str->l - str->offset);

        if ((ret = cargo_vsnprintf(&(*str->s)[str->offset],
                str->diff, format, apc)) < 0)
        {
            CARGODBG(1, "Formatting error\n");
            return -1;
        }

        va_end(apc);

        if ((size_t)ret >= str->diff)
        {
            if (str->l == 0) str->l = CARGO_ASTR_DEFAULT_SIZE;
            str->l *= 2;
            CARGODBG(4, "Realloc %lu\n", str->l);

            if (!(*str->s = _cargo_realloc(*str->s, str->l)))
            {
                CARGODBG(1, "Out of memory!\n");
                return -1;
            }

            continue;
        }

        break;
    }

    str->offset += ret;

    return ret;
}